

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getCenterOfMassJacobian
          (KinDynComputations *this,MatrixDynSize *comJacobian)

{
  bool bVar1;
  MatrixStorageOrdering local_4c;
  MatrixView<double> local_48;
  
  iDynTree::Model::getNrOfDOFs();
  iDynTree::MatrixDynSize::resize((ulong)comJacobian,3);
  local_4c = RowMajor;
  MatrixView<double>::MatrixView<iDynTree::MatrixDynSize,_0>(&local_48,comJacobian,&local_4c);
  bVar1 = getCenterOfMassJacobian(this,&local_48);
  return bVar1;
}

Assistant:

bool KinDynComputations::getCenterOfMassJacobian(MatrixDynSize& comJacobian)
{
    comJacobian.resize(3,pimpl->m_robot_model.getNrOfDOFs()+6);

    return this->getCenterOfMassJacobian(MatrixView<double>(comJacobian));
}